

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O2

void golf_lightmap_image_finalize(golf_lightmap_image_t *lightmap)

{
  int iVar1;
  int iVar2;
  sg_image *psVar3;
  sg_image sVar4;
  void *mem;
  long lVar5;
  int i;
  long lVar6;
  int s;
  long lVar7;
  size_t sVar8;
  sg_image_desc sStack_6c8;
  
  for (lVar7 = 0; lVar7 < lightmap->num_samples; lVar7 = lVar7 + 1) {
    mem = golf_alloc_tracked((long)lightmap->height * (long)lightmap->width * 4,
                             "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/common/level.c"
                            );
    lVar5 = 0;
    lVar6 = 0;
    while( true ) {
      iVar1 = lightmap->width;
      iVar2 = lightmap->height;
      sVar8 = (size_t)(iVar1 * iVar2 * 4);
      if ((long)sVar8 <= lVar6) break;
      *(uchar *)((long)mem + lVar6) = lightmap->data[lVar7][lVar5];
      *(uchar *)((long)mem + lVar6 + 1) = lightmap->data[lVar7][lVar5];
      *(uchar *)((long)mem + lVar6 + 2) = lightmap->data[lVar7][lVar5];
      *(undefined1 *)((long)mem + lVar6 + 3) = 0xff;
      lVar6 = lVar6 + 4;
      lVar5 = lVar5 + 1;
    }
    memset(&sStack_6c8,0,0x698);
    sStack_6c8.pixel_format = SG_PIXELFORMAT_RGBA8;
    sStack_6c8.min_filter = SG_FILTER_LINEAR;
    sStack_6c8.mag_filter = SG_FILTER_LINEAR;
    sStack_6c8.wrap_u = SG_WRAP_CLAMP_TO_EDGE;
    sStack_6c8.wrap_v = SG_WRAP_CLAMP_TO_EDGE;
    psVar3 = lightmap->sg_image;
    sStack_6c8.width = iVar1;
    sStack_6c8.height = iVar2;
    sStack_6c8.data.subimage[0][0].ptr = mem;
    sStack_6c8.data.subimage[0][0].size = sVar8;
    sVar4 = sg_make_image(&sStack_6c8);
    psVar3[lVar7].id = sVar4.id;
    golf_free_tracked(mem);
  }
  return;
}

Assistant:

void golf_lightmap_image_finalize(golf_lightmap_image_t *lightmap) {
    for (int s = 0; s < lightmap->num_samples; s++) {
        unsigned char *sg_image_data = golf_alloc(4 * lightmap->width * lightmap->height);
        for (int i = 0; i < 4 * lightmap->width * lightmap->height; i += 4) {
            sg_image_data[i + 0] = lightmap->data[s][i / 4];
            sg_image_data[i + 1] = lightmap->data[s][i / 4];
            sg_image_data[i + 2] = lightmap->data[s][i / 4];
            sg_image_data[i + 3] = 0xFF;
        }
        sg_image_desc img_desc = {
            .width = lightmap->width,
            .height = lightmap->height,
            .pixel_format = SG_PIXELFORMAT_RGBA8,
            .min_filter = SG_FILTER_LINEAR,
            .mag_filter = SG_FILTER_LINEAR,
            .wrap_u = SG_WRAP_CLAMP_TO_EDGE,
            .wrap_v = SG_WRAP_CLAMP_TO_EDGE,
            .data.subimage[0][0] = {
                .ptr = sg_image_data,
                .size = 4 * lightmap->width * lightmap->height,
            },
        };
        lightmap->sg_image[s] = sg_make_image(&img_desc);
        golf_free(sg_image_data);
    }
}